

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

size_t mpack_expect_enum_optional(mpack_reader_t *reader,char **strings,size_t count)

{
  char *__s;
  uint32_t uVar1;
  int iVar2;
  char *__s1;
  size_t sVar3;
  size_t i;
  size_t sVar4;
  ulong count_00;
  mpack_tag_t mVar5;
  
  if (reader->error == mpack_ok) {
    mVar5 = mpack_peek_tag(reader);
    if (mVar5.type == mpack_type_str) {
      uVar1 = mpack_expect_str(reader);
      count_00 = (ulong)uVar1;
      __s1 = mpack_read_bytes_inplace_notrack(reader,count_00);
      if (reader->error == mpack_ok) {
        for (sVar4 = 0; count != sVar4; sVar4 = sVar4 + 1) {
          __s = strings[sVar4];
          sVar3 = strlen(__s);
          if ((sVar3 == count_00) && (iVar2 = bcmp(__s1,__s,count_00), iVar2 == 0)) {
            return sVar4;
          }
        }
      }
    }
    else {
      mpack_discard(reader);
    }
  }
  return count;
}

Assistant:

size_t mpack_expect_enum_optional(mpack_reader_t* reader, const char* strings[], size_t count) {
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    mpack_assert(count != 0, "count cannot be zero; no strings are valid!");
    mpack_assert(strings != NULL, "strings cannot be NULL");

    // the key is only recognized if it is a string
    if (mpack_peek_tag(reader).type != mpack_type_str) {
        mpack_discard(reader);
        return count;
    }

    // read the string in-place
    size_t keylen = mpack_expect_str(reader);
    const char* key = mpack_read_bytes_inplace(reader, keylen);
    mpack_done_str(reader);
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    // find what key it matches
    for (size_t i = 0; i < count; ++i) {
        const char* other = strings[i];
        size_t otherlen = mpack_strlen(other);
        if (keylen == otherlen && mpack_memcmp(key, other, keylen) == 0)
            return i;
    }

    // no matches
    return count;
}